

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O1

void __thiscall PatternModel::setCursor(PatternModel *this,PatternCursor cursor)

{
  uint in_EAX;
  CursorChangeFlags flags;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if ((this->mPlaying != true) || (this->mFollowing == false)) {
    setCursorRowImpl(this,cursor.super_PatternCursorBase.row,
                     (CursorChangeFlags *)((long)&uStack_28 + 4));
  }
  setCursorColumnImpl(this,cursor.super_PatternCursorBase.column,
                      (CursorChangeFlags *)((long)&uStack_28 + 4));
  setCursorTrackImpl(this,cursor.super_PatternCursorBase.track,
                     (CursorChangeFlags *)((long)&uStack_28 + 4));
  if (uStack_28._4_4_ != 0) {
    cursorChanged(this,uStack_28._4_4_);
    return;
  }
  return;
}

Assistant:

void PatternModel::setCursor(PatternCursor const cursor) {
    CursorChangeFlags flags = CursorUnchanged;
    if (!(mPlaying && mFollowing)) {
        setCursorRowImpl(cursor.row, flags);
    }
    setCursorColumnImpl(cursor.column, flags);
    setCursorTrackImpl(cursor.track, flags);
    emitIfChanged(flags);
}